

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

void __thiscall
kainjow::mustache::
basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
basic_mustache(basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this)

{
  basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  std::__cxx11::string::string((string *)this);
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  component(&this->root_component_);
  std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
  function<std::__cxx11::string(&)(std::__cxx11::string_const&),void>
            ((function<std::__cxx11::string(std::__cxx11::string_const&)> *)&this->escape_,
             html_escape<std::__cxx11::string>);
  return;
}

Assistant:

basic_mustache()
        : escape_(html_escape<string_type>)
    {
    }